

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  pointer pbVar1;
  char *pcVar2;
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar3;
  string *link_command_1;
  pointer pbVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view source;
  string linkScriptName;
  string link_command;
  cmGeneratedFileStream linkScriptStream;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_2e0;
  undefined1 local_2c8 [24];
  undefined8 local_2b0;
  char *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined8 local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  undefined8 local_270;
  size_t local_268;
  char *local_260;
  undefined8 local_258;
  
  local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2e0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
  local_2e0.first._M_len = 0;
  local_2e0.first._M_str = (char *)0x1;
  local_2c8[0] = 0x2f;
  local_280 = 1;
  local_270 = 0;
  local_278 = local_2e0.second;
  local_268 = strlen(name);
  local_258 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_260 = name;
  cmCatViews(&local_320,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_320,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  pbVar4 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (link_commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      if ((pbVar4->_M_string_length != 0) && (pcVar2 = (pbVar4->_M_dataplus)._M_p, *pcVar2 != ':'))
      {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,pcVar2,pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  this_00 = this->LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir(&local_360,(cmOutputConverter *)this_00,&local_320);
  source._M_str = local_360._M_dataplus._M_p;
  source._M_len = local_360._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_340,(cmOutputConverter *)this_00,source,SHELL,false);
  local_2e0.first._M_len = 0x26;
  local_2e0.first._M_str = "$(CMAKE_COMMAND) -E cmake_link_script ";
  local_2e0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2c8._0_8_ = local_340._M_string_length;
  local_2c8._8_8_ = local_340._M_dataplus._M_p;
  local_2b0 = 0x15;
  local_2a8 = " --verbose=$(VERBOSE)";
  local_2a0 = 0;
  views_00._M_len = 3;
  views_00._M_array = &local_2e0;
  local_2c8._16_8_ = &local_340;
  cmCatViews(&local_300,views_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_commands,
             &local_300);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream linkScriptStream(linkScriptName);
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::string const& link_command : link_commands) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!link_command.empty() && link_command[0] != ':') {
      linkScriptStream << link_command << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command =
    cmStrCat("$(CMAKE_COMMAND) -E cmake_link_script ",
             this->LocalGenerator->ConvertToOutputFormat(
               this->LocalGenerator->MaybeRelativeToCurBinDir(linkScriptName),
               cmOutputConverter::SHELL),
             " --verbose=$(VERBOSE)");
  makefile_commands.push_back(std::move(link_command));
  makefile_depends.push_back(std::move(linkScriptName));
}